

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

void resize_multistep(uint8_t *input,int length,uint8_t *output,int olength,uint8_t *otmp)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *output_00;
  ulong uVar5;
  uint length_00;
  uint8_t *input_00;
  ulong uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  byte *pbVar9;
  uint8_t uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int16_t *piVar19;
  bool bVar20;
  
  if (length == olength) {
    memcpy(output,input,(long)length);
    return;
  }
  uVar3 = 0;
  iVar1 = length;
  do {
    iVar1 = iVar1 + 1 >> 1;
    if (iVar1 < olength) break;
    uVar3 = uVar3 + 1;
  } while (iVar1 != 1);
  if (0 < (int)uVar3) {
    iVar1 = length + 1;
    output_00 = (uint8_t *)0x0;
    uVar12 = 0;
    length_00 = length;
    do {
      length = (int)(length_00 + 1) >> 1;
      input_00 = output_00;
      if (uVar12 == 0) {
        input_00 = input;
      }
      output_00 = otmp + (int)(-(uVar12 & 1) & iVar1 >> 1);
      if (length == olength && uVar12 == uVar3 - 1) {
        output_00 = output;
      }
      if ((length_00 & 1) == 0) {
        down2_symeven(input_00,length_00,output_00,0);
      }
      else if ((int)length_00 < 7) {
        if (0 < (int)length_00) {
          uVar5 = 1;
          uVar17 = 0xffffffff;
          uVar6 = 0;
          puVar8 = output_00;
          do {
            iVar11 = (uint)input_00[uVar6] * 0x40 + 0x40;
            lVar13 = 2;
            uVar2 = uVar5;
            uVar4 = uVar17;
            do {
              uVar18 = 0;
              if (0 < (int)uVar4) {
                uVar18 = (ulong)uVar4;
              }
              iVar16 = length_00 - 1;
              if (uVar2 < length_00) {
                iVar16 = (int)uVar2;
              }
              iVar11 = iVar11 + (int)*(short *)((long)av1_down2_symodd_half_filter + lVar13) *
                                ((uint)input_00[iVar16] + (uint)input_00[uVar18]);
              lVar13 = lVar13 + 2;
              uVar2 = uVar2 + 1;
              uVar4 = uVar4 - 1;
            } while (lVar13 != 8);
            iVar11 = iVar11 >> 7;
            if (iVar11 < 1) {
              iVar11 = 0;
            }
            uVar10 = (uint8_t)iVar11;
            if (0xfe < iVar11) {
              uVar10 = 0xff;
            }
            *puVar8 = uVar10;
            puVar8 = puVar8 + 1;
            uVar6 = uVar6 + 2;
            uVar5 = uVar5 + 2;
            uVar17 = uVar17 + 2;
          } while (uVar6 < length_00);
        }
      }
      else {
        uVar17 = 0xffffffff;
        puVar8 = output_00;
        puVar7 = input_00;
        lVar13 = 0;
        do {
          iVar11 = (uint)input_00[lVar13] * 0x40 + 0x40;
          lVar14 = 1;
          uVar4 = uVar17;
          do {
            uVar5 = 0;
            if (0 < (int)uVar4) {
              uVar5 = (ulong)uVar4;
            }
            iVar11 = iVar11 + (int)av1_down2_symodd_half_filter[lVar14] *
                              ((uint)puVar7[lVar14] + (uint)input_00[uVar5]);
            lVar14 = lVar14 + 1;
            uVar4 = uVar4 - 1;
          } while (lVar14 != 4);
          iVar11 = iVar11 >> 7;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          uVar10 = (uint8_t)iVar11;
          if (0xfe < iVar11) {
            uVar10 = 0xff;
          }
          *puVar8 = uVar10;
          puVar8 = puVar8 + 1;
          puVar7 = puVar7 + 2;
          uVar17 = uVar17 + 2;
          bVar20 = lVar13 == 0;
          lVar13 = lVar13 + 2;
        } while (bVar20);
        uVar5 = 4;
        if (length_00 - 3 != 4) {
          puVar7 = input_00 + 5;
          pbVar9 = input_00 + 3;
          uVar5 = 4;
          do {
            iVar11 = (uint)input_00[uVar5] * 0x40 + 0x40;
            lVar13 = 0;
            pbVar15 = pbVar9;
            do {
              iVar11 = iVar11 + (int)av1_down2_symodd_half_filter[lVar13 + 1] *
                                ((uint)puVar7[lVar13] + (uint)*pbVar15);
              lVar13 = lVar13 + 1;
              pbVar15 = pbVar15 + -1;
            } while (lVar13 != 3);
            iVar11 = iVar11 >> 7;
            if (iVar11 < 1) {
              iVar11 = 0;
            }
            uVar10 = (uint8_t)iVar11;
            if (0xfe < iVar11) {
              uVar10 = 0xff;
            }
            *puVar8 = uVar10;
            puVar8 = puVar8 + 1;
            uVar5 = uVar5 + 2;
            puVar7 = puVar7 + 2;
            pbVar9 = pbVar9 + 2;
          } while (uVar5 < length_00 - 3);
        }
        if ((int)uVar5 < (int)length_00) {
          uVar5 = uVar5 & 0xffffffff;
          uVar6 = uVar5 + 1;
          puVar7 = input_00 + (uVar5 - 1);
          do {
            iVar11 = (uint)input_00[uVar5] * 0x40 + 0x40;
            lVar13 = 3;
            piVar19 = av1_down2_symodd_half_filter;
            uVar2 = uVar6;
            do {
              piVar19 = piVar19 + 1;
              iVar16 = length_00 - 1;
              if (uVar2 < length_00) {
                iVar16 = (int)uVar2;
              }
              iVar11 = iVar11 + (int)*piVar19 * ((uint)input_00[iVar16] + (uint)puVar7[lVar13 + -3])
              ;
              uVar2 = uVar2 + 1;
              lVar13 = lVar13 + -1;
            } while (lVar13 != 0);
            iVar16 = iVar11 >> 7;
            if (iVar11 >> 7 < 1) {
              iVar16 = 0;
            }
            uVar10 = (uint8_t)iVar16;
            if (0xfe < iVar16) {
              uVar10 = 0xff;
            }
            *puVar8 = uVar10;
            puVar8 = puVar8 + 1;
            uVar5 = uVar5 + 2;
            uVar6 = uVar6 + 2;
            puVar7 = puVar7 + 2;
          } while ((int)uVar5 < (int)length_00);
        }
      }
      uVar12 = uVar12 + 1;
      length_00 = length;
    } while (uVar12 != uVar3);
    input = output_00;
    if (length == olength) {
      return;
    }
  }
  interpolate(input,length,output,olength);
  return;
}

Assistant:

static void resize_multistep(const uint8_t *const input, int length,
                             uint8_t *output, int olength, uint8_t *otmp) {
  if (length == olength) {
    memcpy(output, input, sizeof(output[0]) * length);
    return;
  }
  const int steps = get_down2_steps(length, olength);

  if (steps > 0) {
    uint8_t *out = NULL;
    int filteredlength = length;

    assert(otmp != NULL);
    uint8_t *otmp2 = otmp + get_down2_length(length, 1);
    for (int s = 0; s < steps; ++s) {
      const int proj_filteredlength = get_down2_length(filteredlength, 1);
      const uint8_t *const in = (s == 0 ? input : out);
      if (s == steps - 1 && proj_filteredlength == olength)
        out = output;
      else
        out = (s & 1 ? otmp2 : otmp);
      if (filteredlength & 1)
        down2_symodd(in, filteredlength, out);
      else
        down2_symeven(in, filteredlength, out, 0);
      filteredlength = proj_filteredlength;
    }
    if (filteredlength != olength) {
      interpolate(out, filteredlength, output, olength);
    }
  } else {
    interpolate(input, length, output, olength);
  }
}